

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_debugXML(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  xmlDocPtr pxVar6;
  xmlAttrPtr pxVar7;
  xmlDtdPtr val;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr pxVar10;
  xmlXPathObjectPtr pxVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int nr;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  int n_node;
  int n_boolval;
  uint uVar12;
  uint uVar13;
  undefined4 uVar14;
  int n_depth;
  undefined4 *puVar15;
  ulong uVar16;
  int iVar17;
  undefined8 *puVar18;
  int n_node2;
  int iVar19;
  bool bVar20;
  int test_ret;
  int test_ret_2;
  int test_ret_4;
  int test_ret_1;
  int test_ret_3;
  int local_48;
  int local_44;
  ulong local_40;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing debugXML : 25 of 28 functions ...");
  }
  puVar15 = &DAT_00163454;
  uVar12 = 0;
  iVar17 = 0;
  do {
    iVar1 = xmlMemBlocks();
    uVar14 = 0xffffffff;
    if (uVar12 < 4) {
      uVar14 = *puVar15;
    }
    xmlBoolToText(uVar14);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBoolToText",(ulong)(uint)(iVar2 - iVar1));
      iVar17 = iVar17 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = uVar12 + 1;
    puVar15 = puVar15 + 1;
  } while (uVar12 != 4);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar12 = 0;
  do {
    uVar13 = 0;
    do {
      iVar1 = xmlMemBlocks();
      iVar2 = 0x1559d2;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(uVar13,iVar2);
      xmlDebugCheckDocument(pFVar5,pxVar6);
      call_tests = call_tests + 1;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
      }
      if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
        xmlFreeDoc(pxVar6);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugCheckDocument",(ulong)(uint)(iVar2 - iVar1));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d",(ulong)uVar13);
        putchar(10);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 4);
    bVar20 = uVar12 == 0;
    uVar12 = uVar12 + 1;
  } while (bVar20);
  function_tests = function_tests + 1;
  local_38 = 0;
  local_40 = 0;
  do {
    uVar12 = 0;
    do {
      uVar16 = 0;
      puVar15 = &DAT_00163454;
      do {
        iVar1 = xmlMemBlocks();
        iVar2 = 0x1559d2;
        pFVar5 = fopen64("test.out","a+");
        pxVar7 = gen_xmlAttrPtr(uVar12,iVar2);
        uVar14 = 0xffffffff;
        if ((uint)uVar16 < 4) {
          uVar14 = *puVar15;
        }
        xmlDebugDumpAttr(pFVar5,pxVar7,uVar14);
        call_tests = call_tests + 1;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
        }
        if (uVar12 == 0) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttr",(ulong)(uint)(iVar2 - iVar1));
          local_38 = local_38 + 1;
          printf(" %d",local_40);
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar13 = (uint)uVar16 + 1;
        uVar16 = (ulong)uVar13;
        puVar15 = puVar15 + 1;
      } while (uVar13 != 4);
      bVar20 = uVar12 == 0;
      uVar12 = uVar12 + 1;
    } while (bVar20);
    iVar1 = (int)local_40;
    local_40 = (ulong)(iVar1 + 1);
  } while (iVar1 == 0);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_40 = 0;
  do {
    uVar12 = 0;
    do {
      uVar16 = 0;
      puVar15 = &DAT_00163454;
      do {
        iVar1 = xmlMemBlocks();
        iVar2 = 0x1559d2;
        pFVar5 = fopen64("test.out","a+");
        pxVar7 = gen_xmlAttrPtr(uVar12,iVar2);
        uVar14 = 0xffffffff;
        if ((uint)uVar16 < 4) {
          uVar14 = *puVar15;
        }
        xmlDebugDumpAttrList(pFVar5,pxVar7,uVar14);
        call_tests = call_tests + 1;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
        }
        if (uVar12 == 0) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpAttrList",(ulong)(uint)(iVar2 - iVar1));
          local_44 = local_44 + 1;
          printf(" %d",local_40);
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar13 = (uint)uVar16 + 1;
        uVar16 = (ulong)uVar13;
        puVar15 = puVar15 + 1;
      } while (uVar13 != 4);
      bVar20 = uVar12 == 0;
      uVar12 = uVar12 + 1;
    } while (bVar20);
    iVar1 = (int)local_40;
    local_40 = (ulong)(iVar1 + 1);
  } while (iVar1 == 0);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar16 = 0;
  do {
    uVar12 = 0;
    do {
      iVar2 = xmlMemBlocks();
      iVar1 = 0x1559d2;
      pFVar5 = fopen64("test.out","a+");
      val = gen_xmlDtdPtr(uVar12,iVar1);
      xmlDebugDumpDTD(pFVar5,val);
      call_tests = call_tests + 1;
      iVar1 = extraout_EDX;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar1 = extraout_EDX_00;
      }
      des_xmlDtdPtr(uVar12,val,iVar1);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      iVar3 = (int)uVar16;
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDTD",(ulong)(uint)(iVar1 - iVar2));
        local_34 = local_34 + 1;
        printf(" %d",uVar16);
        printf(" %d",(ulong)uVar12);
        putchar(10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
    uVar16 = (ulong)(iVar3 + 1);
  } while (iVar3 == 0);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar16 = 0;
  do {
    uVar12 = 0;
    do {
      iVar2 = xmlMemBlocks();
      iVar3 = 0x1559d2;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(uVar12,iVar3);
      xmlDebugDumpDocument(pFVar5,pxVar6);
      call_tests = call_tests + 1;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
      }
      if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
        xmlFreeDoc(pxVar6);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      iVar4 = (int)uVar16;
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocument",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",uVar16);
        printf(" %d",(ulong)uVar12);
        putchar(10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 4);
    uVar16 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  function_tests = function_tests + 1;
  iVar17 = local_48 + iVar17 + local_38 + local_44;
  local_44 = 0;
  uVar16 = 0;
  do {
    uVar12 = 0;
    do {
      iVar2 = xmlMemBlocks();
      iVar3 = 0x1559d2;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(uVar12,iVar3);
      xmlDebugDumpDocumentHead(pFVar5,pxVar6);
      call_tests = call_tests + 1;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
      }
      if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
        xmlFreeDoc(pxVar6);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      iVar4 = (int)uVar16;
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocumentHead",(ulong)(uint)(iVar3 - iVar2));
        local_44 = local_44 + 1;
        printf(" %d",uVar16);
        printf(" %d",(ulong)uVar12);
        putchar(10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 4);
    uVar16 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  function_tests = function_tests + 1;
  iVar17 = iVar17 + local_34;
  local_34 = 0;
  uVar16 = 0;
  do {
    uVar12 = 0;
    do {
      iVar2 = xmlMemBlocks();
      iVar3 = 0x1559d2;
      pFVar5 = fopen64("test.out","a+");
      pxVar6 = gen_xmlDocPtr(uVar12,iVar3);
      xmlDebugDumpEntities(pFVar5,pxVar6);
      call_tests = call_tests + 1;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
      }
      if (((pxVar6 != (xmlDocPtr)0x0) && (api_doc != pxVar6)) && (pxVar6->doc != api_doc)) {
        xmlFreeDoc(pxVar6);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      iVar4 = (int)uVar16;
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpEntities",(ulong)(uint)(iVar3 - iVar2));
        local_34 = local_34 + 1;
        printf(" %d",uVar16);
        printf(" %d",(ulong)uVar12);
        putchar(10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 4);
    uVar16 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  function_tests = function_tests + 1;
  local_38 = 0;
  local_40 = 0;
  do {
    uVar12 = 0;
    do {
      uVar16 = 0;
      puVar15 = &DAT_00163454;
      do {
        iVar2 = xmlMemBlocks();
        iVar3 = 0x1559d2;
        pFVar5 = fopen64("test.out","a+");
        pxVar8 = gen_xmlNodePtr(uVar12,iVar3);
        uVar14 = 0xffffffff;
        if ((uint)uVar16 < 4) {
          uVar14 = *puVar15;
        }
        xmlDebugDumpNode(pFVar5,pxVar8,uVar14);
        call_tests = call_tests + 1;
        iVar3 = extraout_EDX_01;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          iVar3 = extraout_EDX_02;
        }
        des_xmlNodePtr(uVar12,pxVar8,iVar3);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpNode",(ulong)(uint)(iVar3 - iVar2));
          local_38 = local_38 + 1;
          printf(" %d",local_40);
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar13 = (uint)uVar16 + 1;
        uVar16 = (ulong)uVar13;
        puVar15 = puVar15 + 1;
      } while (uVar13 != 4);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
    iVar2 = (int)local_40;
    local_40 = (ulong)(iVar2 + 1);
  } while (iVar2 == 0);
  function_tests = function_tests + 1;
  iVar17 = iVar17 + iVar1 + local_44;
  local_44 = 0;
  local_40 = 0;
  do {
    uVar12 = 0;
    do {
      uVar16 = 0;
      puVar15 = &DAT_00163454;
      do {
        iVar1 = xmlMemBlocks();
        iVar2 = 0x1559d2;
        pFVar5 = fopen64("test.out","a+");
        pxVar8 = gen_xmlNodePtr(uVar12,iVar2);
        uVar14 = 0xffffffff;
        if ((uint)uVar16 < 4) {
          uVar14 = *puVar15;
        }
        xmlDebugDumpNodeList(pFVar5,pxVar8,uVar14);
        call_tests = call_tests + 1;
        iVar2 = extraout_EDX_03;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          iVar2 = extraout_EDX_04;
        }
        des_xmlNodePtr(uVar12,pxVar8,iVar2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpNodeList",(ulong)(uint)(iVar2 - iVar1));
          local_44 = local_44 + 1;
          printf(" %d",local_40);
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar13 = (uint)uVar16 + 1;
        uVar16 = (ulong)uVar13;
        puVar15 = puVar15 + 1;
      } while (uVar13 != 4);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
    iVar1 = (int)local_40;
    local_40 = (ulong)(iVar1 + 1);
  } while (iVar1 == 0);
  function_tests = function_tests + 1;
  iVar17 = iVar17 + local_34;
  local_34 = 0;
  local_40 = 0;
  do {
    uVar12 = 0;
    do {
      uVar16 = 0;
      puVar15 = &DAT_00163454;
      do {
        iVar1 = xmlMemBlocks();
        iVar2 = 0x1559d2;
        pFVar5 = fopen64("test.out","a+");
        pxVar8 = gen_xmlNodePtr(uVar12,iVar2);
        uVar14 = 0xffffffff;
        if ((uint)uVar16 < 4) {
          uVar14 = *puVar15;
        }
        xmlDebugDumpOneNode(pFVar5,pxVar8,uVar14);
        call_tests = call_tests + 1;
        iVar2 = extraout_EDX_05;
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          iVar2 = extraout_EDX_06;
        }
        des_xmlNodePtr(uVar12,pxVar8,iVar2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDebugDumpOneNode",(ulong)(uint)(iVar2 - iVar1));
          local_34 = local_34 + 1;
          printf(" %d",local_40);
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar16);
          putchar(10);
        }
        uVar13 = (uint)uVar16 + 1;
        uVar16 = (ulong)uVar13;
        puVar15 = puVar15 + 1;
      } while (uVar13 != 4);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
    iVar1 = (int)local_40;
    local_40 = (ulong)(iVar1 + 1);
  } while (iVar1 == 0);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar16 = 0;
  do {
    puVar18 = &DAT_00165d70;
    pxVar8 = (xmlNodePtr)0x0;
    do {
      iVar2 = xmlMemBlocks();
      pFVar5 = fopen64("test.out","a+");
      uVar12 = (uint)pxVar8;
      if (uVar12 < 4) {
        pxVar9 = (xmlNodePtr)*puVar18;
      }
      else {
        pxVar9 = (xmlNodePtr)0x0;
      }
      xmlDebugDumpString(pFVar5);
      call_tests = call_tests + 1;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      iVar4 = (int)uVar16;
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpString",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",uVar16);
        printf(" %d");
        putchar(10);
        pxVar9 = pxVar8;
      }
      uVar12 = uVar12 + 1;
      pxVar8 = (xmlNodePtr)(ulong)uVar12;
      puVar18 = puVar18 + 1;
    } while (uVar12 != 5);
    uVar16 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  iVar17 = iVar17 + local_38 + local_44;
  function_tests = function_tests + 1;
  uVar12 = 0;
  local_38 = 0;
  do {
    iVar3 = (int)pxVar9;
    iVar2 = xmlMemBlocks();
    pxVar9 = gen_xmlNodePtr(uVar12,iVar3);
    xmlLsCountNode(pxVar9);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar12,pxVar9,nr);
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLsCountNode",(ulong)(uint)(iVar3 - iVar2));
      local_38 = local_38 + 1;
      pxVar9 = (xmlNodePtr)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar12 = 0;
  do {
    uVar13 = 0;
    do {
      iVar3 = xmlMemBlocks();
      iVar2 = 0x1559d2;
      pFVar5 = fopen64("test.out","a+");
      pxVar8 = gen_xmlNodePtr(uVar13,iVar2);
      xmlLsOneNode(pFVar5,pxVar8);
      call_tests = call_tests + 1;
      iVar2 = extraout_EDX_07;
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        iVar2 = extraout_EDX_08;
      }
      des_xmlNodePtr(uVar13,pxVar8,iVar2);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar3 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlLsOneNode",(ulong)(uint)(iVar2 - iVar3));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar12);
        pxVar8 = (xmlNodePtr)(ulong)uVar13;
        printf(" %d");
        putchar(10);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 3);
    bVar20 = uVar12 == 0;
    uVar12 = uVar12 + 1;
  } while (bVar20);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)pxVar8;
      iVar3 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar4);
      iVar19 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar19,iVar4);
      xmlShellBase(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_00);
      des_xmlNodePtr(iVar19,pxVar8,nr_01);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellBase",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar19 + 1U);
    } while (iVar19 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  iVar17 = iVar17 + local_34 + iVar1 + local_38;
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar3 = (int)pxVar8;
      iVar1 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar3);
      iVar4 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar4,iVar3);
      xmlShellCat(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_02);
      des_xmlNodePtr(iVar4,pxVar8,nr_03);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar1 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellCat",(ulong)(uint)(iVar3 - iVar1));
        local_38 = local_38 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  iVar17 = iVar17 + local_44;
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar3 = (int)pxVar8;
      iVar1 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar3);
      iVar4 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar4,iVar3);
      xmlShellDir(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_04);
      des_xmlNodePtr(iVar4,pxVar8,nr_05);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar1 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellDir",(ulong)(uint)(iVar3 - iVar1));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)pxVar8;
      iVar3 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar4);
      iVar19 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar19,iVar4);
      xmlShellDu(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_06);
      des_xmlNodePtr(iVar19,pxVar8,nr_07);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellDu",(ulong)(uint)(iVar4 - iVar3));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar19 + 1U);
    } while (iVar19 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  iVar17 = iVar17 + iVar2 + local_38;
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar3 = (int)pxVar8;
      iVar2 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar3);
      iVar4 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar4,iVar3);
      xmlShellList(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_08);
      des_xmlNodePtr(iVar4,pxVar8,nr_09);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellList",(ulong)(uint)(iVar3 - iVar2));
        local_38 = local_38 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  iVar17 = iVar17 + local_44;
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar3 = (int)pxVar8;
      iVar2 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar3);
      iVar4 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar4,iVar3);
      xmlShellLoad(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_10);
      des_xmlNodePtr(iVar4,pxVar8,nr_11);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellLoad",(ulong)(uint)(iVar3 - iVar2));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  function_tests = function_tests + 1;
  uVar12 = 0;
  local_34 = 0;
  do {
    iVar2 = xmlMemBlocks();
    pxVar11 = gen_xmlXPathObjectPtr(uVar12,(int)pxVar8);
    xmlShellPrintXPathResult(pxVar11);
    call_tests = call_tests + 1;
    if (pxVar11 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar11);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlShellPrintXPathResult",(ulong)(uint)(iVar3 - iVar2));
      local_34 = local_34 + 1;
      pxVar8 = (xmlNodePtr)(ulong)uVar12;
      printf(" %d");
      putchar(10);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)pxVar8;
      iVar3 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar4);
      iVar19 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar19,iVar4);
      xmlShellPwd(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_12);
      des_xmlNodePtr(iVar19,pxVar8,nr_13);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellPwd",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar19 + 1U);
    } while (iVar19 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  iVar17 = iVar17 + iVar1 + local_38 + local_44;
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar3 = (int)pxVar8;
      iVar1 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar3);
      iVar4 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar4,iVar3);
      xmlShellSave(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_14);
      des_xmlNodePtr(iVar4,pxVar8,nr_15);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar1 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellSave",(ulong)(uint)(iVar3 - iVar1));
        local_38 = local_38 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar3 = (int)pxVar8;
      iVar1 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar3);
      iVar4 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar4,iVar3);
      xmlShellValidate(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_16);
      des_xmlNodePtr(iVar4,pxVar8,nr_17);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar1 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellValidate",(ulong)(uint)(iVar3 - iVar1));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar12 = 0;
  do {
    pxVar9 = (xmlNodePtr)0x0;
    do {
      iVar4 = (int)pxVar8;
      iVar3 = xmlMemBlocks();
      pxVar10 = gen_xmlNodePtr(uVar12,iVar4);
      iVar19 = (int)pxVar9;
      pxVar8 = gen_xmlNodePtr(iVar19,iVar4);
      xmlShellWrite(0,0,pxVar10,pxVar8);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar12,pxVar10,nr_18);
      des_xmlNodePtr(iVar19,pxVar8,nr_19);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlShellWrite",(ulong)(uint)(iVar4 - iVar3));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
        pxVar8 = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar19 + 1U);
    } while (iVar19 + 1U != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  function_tests = function_tests + 1;
  uVar12 = iVar17 + local_34 + iVar2 + local_38 + local_44 + iVar1;
  if (uVar12 != 0) {
    printf("Module debugXML: %d errors\n",(ulong)uVar12);
  }
  return uVar12;
}

Assistant:

static int
test_debugXML(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing debugXML : 25 of 28 functions ...\n");
    test_ret += test_xmlBoolToText();
    test_ret += test_xmlDebugCheckDocument();
    test_ret += test_xmlDebugDumpAttr();
    test_ret += test_xmlDebugDumpAttrList();
    test_ret += test_xmlDebugDumpDTD();
    test_ret += test_xmlDebugDumpDocument();
    test_ret += test_xmlDebugDumpDocumentHead();
    test_ret += test_xmlDebugDumpEntities();
    test_ret += test_xmlDebugDumpNode();
    test_ret += test_xmlDebugDumpNodeList();
    test_ret += test_xmlDebugDumpOneNode();
    test_ret += test_xmlDebugDumpString();
    test_ret += test_xmlLsCountNode();
    test_ret += test_xmlLsOneNode();
    test_ret += test_xmlShell();
    test_ret += test_xmlShellBase();
    test_ret += test_xmlShellCat();
    test_ret += test_xmlShellDir();
    test_ret += test_xmlShellDu();
    test_ret += test_xmlShellList();
    test_ret += test_xmlShellLoad();
    test_ret += test_xmlShellPrintXPathResult();
    test_ret += test_xmlShellPwd();
    test_ret += test_xmlShellSave();
    test_ret += test_xmlShellValidate();
    test_ret += test_xmlShellWrite();

    if (test_ret != 0)
	printf("Module debugXML: %d errors\n", test_ret);
    return(test_ret);
}